

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserManager.hpp
# Opt level: O3

bool __thiscall sjtu::UserManager::is_login(UserManager *this,string *username)

{
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this_00;
  pointer pcVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  long lVar4;
  bool bVar5;
  pair<long,_bool> pVar6;
  long *local_60;
  long local_58;
  long local_50 [2];
  long local_40;
  char local_38;
  ulong local_30;
  
  this_00 = this->UserBpTree;
  pcVar1 = (username->_M_dataplus)._M_p;
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + username->_M_string_length);
  if (local_58 == 0) {
    local_30 = 0;
  }
  else {
    lVar4 = 0;
    lVar3 = 0;
    local_30 = 0;
    do {
      lVar3 = ((long)*(char *)((long)local_60 + lVar4) + lVar3 * 0x239 + 0x100) % 0x3b800001;
      local_30 = (long)((long)*(char *)((long)local_60 + lVar4) + local_30 * 0x301 + 0x100) %
                 0x3b9aca07;
      lVar4 = lVar4 + 1;
    } while (local_58 != lVar4);
    local_30 = lVar3 << 0x20 | local_30;
  }
  pVar6 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                    (this_00,&local_30);
  local_40 = pVar6.first;
  bVar5 = pVar6.second;
  local_38 = bVar5;
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if (bVar5 == false) {
    bVar5 = false;
  }
  else {
    iVar2 = (*(this->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[2])
                      (this->UserFile,&local_40);
    bVar5 = *(uint *)(CONCAT44(extraout_var,iVar2) + 0x6c) == this->online_flag;
  }
  return bVar5;
}

Assistant:

bool is_login(std::string username) {
            std::pair<locType, bool> tmp = UserBpTree->find(hasher(username));
            if (tmp.second == false) return false;
            else {
                userType *cur = UserFile->read(tmp.first);
                return cur->is_online == online_flag;
            }
        }